

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandShow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk0;
  char *pcVar3;
  uint fUseReverse;
  uint fSeq;
  char *pcVar4;
  uint local_3c;
  
  pNtk0 = Abc_FrameReadNtk(pAbc);
  fSeq = 0;
  Extra_UtilGetoptReset();
  fUseReverse = 1;
  local_3c = 0;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"rsgfh"), iVar2 == 0x66) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (0x71 < iVar2) break;
        if (iVar2 == -1) {
          if (pNtk0 != (Abc_Ntk_t *)0x0) {
            if (bVar1) {
              Abc_NtkShowFlopDependency(pNtk0);
            }
            else {
              Abc_NtkShow(pNtk0,local_3c,fSeq,fUseReverse);
            }
            return 0;
          }
          pcVar3 = "Empty network.\n";
          iVar2 = -1;
          goto LAB_002037eb;
        }
        if (iVar2 != 0x67) goto LAB_00203714;
        local_3c = local_3c ^ 1;
      }
      if (iVar2 != 0x73) break;
      fSeq = fSeq ^ 1;
    }
    if (iVar2 != 0x72) break;
    fUseReverse = fUseReverse ^ 1;
  }
LAB_00203714:
  Abc_Print(-2,"usage: show [-srgfh]\n");
  Abc_Print(-2,"       visualizes the network structure using DOT and GSVIEW\n");
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fSeq == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s    : toggles visualization of sequential networks [default = %s].\n",pcVar3);
  pcVar3 = "yes";
  if (fUseReverse == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-r    : toggles ordering nodes in reverse order [default = %s].\n",pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-g    : toggles printing gate names for mapped network [default = %s].\n",pcVar3);
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-f    : toggles visualizing flop dependency graph [default = %s].\n",pcVar4);
  pcVar3 = "\t-h    : print the command usage\n";
  iVar2 = -2;
LAB_002037eb:
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandShow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fSeq;
    int fGateNames;
    int fUseReverse;
    int fFlopDep;
    extern void Abc_NtkShow( Abc_Ntk_t * pNtk, int fGateNames, int fSeq, int fUseReverse );
    extern void Abc_NtkShowFlopDependency( Abc_Ntk_t * pNtk );

    // set defaults
    fSeq        = 0;
    fGateNames  = 0;
    fUseReverse = 1;
    fFlopDep    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rsgfh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fUseReverse ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'g':
            fGateNames ^= 1;
            break;
        case 'f':
            fFlopDep ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fFlopDep )
        Abc_NtkShowFlopDependency( pNtk );
    else
        Abc_NtkShow( pNtk, fGateNames, fSeq, fUseReverse );
    return 0;

usage:
    Abc_Print( -2, "usage: show [-srgfh]\n" );
    Abc_Print( -2, "       visualizes the network structure using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t-s    : toggles visualization of sequential networks [default = %s].\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggles ordering nodes in reverse order [default = %s].\n", fUseReverse? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggles printing gate names for mapped network [default = %s].\n", fGateNames? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggles visualizing flop dependency graph [default = %s].\n", fFlopDep? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}